

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O2

void display_object_recall(object *obj)

{
  textblock *tb;
  char header_buf [120];
  
  tb = object_info(obj,OINFO_NONE);
  object_desc(header_buf,0x78,obj,0x43,player);
  clear_from(L'\0');
  textui_textblock_place(tb,(region)ZEXT816(0),header_buf);
  textblock_free(tb);
  return;
}

Assistant:

void display_object_recall(struct object *obj)
{
	char header_buf[120];

	textblock *tb = object_info(obj, OINFO_NONE);
	object_desc(header_buf, sizeof(header_buf), obj,
		ODESC_PREFIX | ODESC_FULL, player);

	clear_from(0);
	textui_textblock_place(tb, SCREEN_REGION, header_buf);
	textblock_free(tb);
}